

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrib.c
# Opt level: O2

void losestr(int num,boolean force)

{
  uint incr;
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar1 = u.acurr.a[0] - num;
  iVar2 = u.mh;
  iVar3 = u.mhmax;
  do {
    incr = -num;
    while( true ) {
      if (2 < iVar1) {
        adjattrib(0,incr,force,1);
        return;
      }
      if (u.umonnum == u.umonster) break;
      iVar2 = iVar2 + -6;
      iVar3 = iVar3 + -6;
      incr = incr + 1;
      iVar1 = iVar1 + 1;
      u.mh = iVar2;
      u.mhmax = iVar3;
    }
    u.uhp = u.uhp + -6;
    u.uhpmax = u.uhpmax + -6;
    num = ~incr;
    iVar1 = iVar1 + 1;
  } while( true );
}

Assistant:

void losestr(int num, boolean force)
{
	int ustr = ABASE(A_STR) - num;

	while (ustr < 3) {
	    ++ustr;
	    --num;
	    if (Upolyd) {
		u.mh -= 6;
		u.mhmax -= 6;
	    } else {
		u.uhp -= 6;
		u.uhpmax -= 6;
	    }
	}
	adjattrib(A_STR, -num, force, 1);
}